

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManLutLevel(Gia_Man_t *p,int **ppLevels)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *__ptr;
  size_t sVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  size_t __nmemb;
  
  iVar2 = p->nObjs;
  __nmemb = (size_t)iVar2;
  __ptr = (int *)calloc(__nmemb,4);
  if (1 < (long)__nmemb) {
    pVVar5 = p->vMapping;
    sVar7 = 1;
    do {
      iVar8 = pVVar5->nSize;
      if ((long)iVar8 <= (long)sVar7) {
LAB_0020b438:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = pVVar5->pArray;
      uVar3 = piVar6[sVar7];
      if ((ulong)uVar3 != 0) {
        if (iVar8 <= (int)uVar3 || (int)uVar3 < 0) goto LAB_0020b438;
        puVar1 = (uint *)(piVar6 + uVar3);
        uVar4 = *puVar1;
        uVar12 = 0;
        uVar10 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar10 = uVar12;
        }
        iVar13 = 0;
        while (uVar10 != uVar12) {
          if (iVar13 <= __ptr[(int)puVar1[uVar12 + 1]]) {
            iVar13 = __ptr[(int)puVar1[uVar12 + 1]];
          }
          uVar12 = uVar12 + 1;
          if (iVar8 <= (int)uVar3 || (int)uVar3 < 0) goto LAB_0020b438;
        }
        __ptr[sVar7] = iVar13 + 1;
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != __nmemb);
  }
  pVVar5 = p->vCos;
  if (pVVar5->nSize < 1) {
    iVar8 = 0;
  }
  else {
    piVar6 = pVVar5->pArray;
    lVar9 = 0;
    iVar8 = 0;
    do {
      iVar13 = piVar6[lVar9];
      lVar11 = (long)iVar13;
      if ((lVar11 < 0) || (iVar2 <= iVar13)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar13 = __ptr[(int)(iVar13 - (*(uint *)(p->pObjs + lVar11) & 0x1fffffff))];
      if (iVar8 <= iVar13) {
        iVar8 = iVar13;
      }
      __ptr[lVar11] = iVar13;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar5->nSize);
  }
  if (ppLevels == (int **)0x0) {
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  else {
    *ppLevels = __ptr;
  }
  return iVar8;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p, int ** ppLevels )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
    {
        int LevelFan = pLevels[Gia_ObjFaninId0p(p, pObj)];
        Level = Abc_MaxInt( Level, LevelFan );
        pLevels[Gia_ObjId(p, pObj)] = LevelFan;
    }
    if ( ppLevels )
        *ppLevels = pLevels;
    else
        ABC_FREE( pLevels );
    return Level;
}